

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O3

int wally_ripemd160(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  
  iVar1 = -2;
  if ((len == 0x14 && bytes_out != (uchar *)0x0) && (bytes_len == 0 || bytes != (uchar *)0x0)) {
    ripemd160((ripemd160 *)bytes_out,bytes,bytes_len);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_ripemd160(const unsigned char *bytes, size_t bytes_len,
                  unsigned char *bytes_out, size_t len)
{
    struct ripemd160 ripemd;
    const bool aligned = alignment_ok(bytes_out, sizeof(ripemd.u.u32));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != RIPEMD160_LEN)
        return WALLY_EINVAL;

    BUILD_ASSERT(sizeof(ripemd) == RIPEMD160_LEN);

    ripemd160(aligned ? (struct ripemd160 *)bytes_out : &ripemd, bytes, bytes_len);
    if (!aligned) {
        memcpy(bytes_out, &ripemd, sizeof(ripemd));
        wally_clear(&ripemd, sizeof(ripemd));
    }
    return WALLY_OK;
}